

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createLocalFunctionNode
          (Parser *this,Token *t,Node *optional_name,Node *parameters_list,Node *function_body)

{
  Node *this_00;
  vector<Node_*,_std::allocator<Node_*>_> *this_01;
  Node *function_body_local;
  Node *parameters_list_local;
  Node *optional_name_local;
  
  function_body_local = function_body;
  parameters_list_local = parameters_list;
  optional_name_local = optional_name;
  this_00 = (Node *)operator_new(0x30);
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_LOCAL_FUNCTION;
  this_01 = &this_00->children;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&optional_name_local);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&parameters_list_local);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this_01,&function_body_local);
  return this_00;
}

Assistant:

Node * createLocalFunctionNode(Token & t, Node * optional_name, Node * parameters_list, Node * function_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_FUNCTION;
    n->children.push_back(optional_name);
    n->children.push_back(parameters_list);
    n->children.push_back(function_body);
    return n;
  }